

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.hpp
# Opt level: O2

void __thiscall Excel::Formula::parse(Formula *this,Record *record)

{
  RecordSubstream *this_00;
  ulong uVar1;
  ValueType VVar2;
  anon_union_8_2_91d51eec doubleAsLongLong;
  
  this_00 = &record->m_stream;
  Stream::read<short>(&this_00->super_Stream,&this->m_row,2);
  Stream::read<short>(&this_00->super_Stream,&this->m_column,2);
  VVar2 = DoubleValue;
  (*(record->m_stream).super_Stream._vptr_Stream[4])(this_00,2,1);
  Stream::read<long>(&this_00->super_Stream,&doubleAsLongLong.m_long,8);
  uVar1 = doubleAsLongLong.m_long & 0xffffffffff00ffff;
  if (uVar1 == 0xffff000000000003) {
    VVar2 = EmptyCell;
  }
  else if (uVar1 == 0xffff000000000002) {
    this->m_errorValue = (ErrorValues)((ulong)doubleAsLongLong >> 0x10);
    VVar2 = ErrorValue;
  }
  else if (uVar1 == 0xffff000000000001) {
    this->m_boolValue = (doubleAsLongLong.m_long & 0xff0000U) != 0;
    VVar2 = BooleanValue;
  }
  else if (doubleAsLongLong.m_long == -0x1000000000000) {
    VVar2 = StringValue;
  }
  else {
    this->m_doubleValue = (double)doubleAsLongLong;
  }
  this->m_valueType = VVar2;
  return;
}

Assistant:

inline void
Formula::parse( Record & record )
{
	record.dataStream().read( m_row, 2 );
	record.dataStream().read( m_column, 2 );

	record.dataStream().seek( 2, Stream::FromCurrent );

	union {
		double m_double;
		int64_t m_long;
	} doubleAsLongLong;

	record.dataStream().read( doubleAsLongLong.m_long, 8 );

	unsigned long long isBool = doubleAsLongLong.m_long & 0xFFFFFFFFFF00FFFF;

	if( isBool == 0xFFFF000000000001 )
	{
		m_boolValue = ( doubleAsLongLong.m_long & 0x0000000000FF0000 ) >> 16;
		m_valueType = BooleanValue;

		return;
	}

	unsigned long long isError = doubleAsLongLong.m_long & 0xFFFFFFFFFF00FFFF;

	if( isError == 0xFFFF000000000002 )
	{
		unsigned char error =
			static_cast< unsigned char >
				( ( doubleAsLongLong.m_long & 0x0000000000FF0000 ) >> 16 );

		m_errorValue = (ErrorValues) error;
		m_valueType = ErrorValue;

		return;
	}

	unsigned long long isEmpty = doubleAsLongLong.m_long & 0xFFFFFFFFFF00FFFF;

	if( isEmpty == 0xFFFF000000000003 )
	{
		m_valueType = EmptyCell;

		return;
	}

	unsigned long long isString = doubleAsLongLong.m_long & 0xFFFFFFFFFFFFFFFF;

	if( isString == 0xFFFF000000000000 )
	{
		m_valueType = StringValue;

		return;
	}

	m_doubleValue = doubleAsLongLong.m_double;
	m_valueType = DoubleValue;
}